

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

unique_ptr<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>_>
 __thiscall
pstore::sparse_array<int,unsigned_long>::make_unique<std::pair<unsigned_long,int>const*>
          (sparse_array<int,unsigned_long> *this,pair<unsigned_long,_int> *begin,
          pair<unsigned_long,_int> *end)

{
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  indices_first;
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  first_index;
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  indices_last;
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  last_index;
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  last_value;
  pointer __p;
  pair<unsigned_long,_int> *in_stack_fffffffffffffee8;
  _Head_base<0UL,_pstore::sparse_array<int,_unsigned_long>_*,_false> _Var1;
  undefined8 in_stack_ffffffffffffff00;
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  in_stack_ffffffffffffff08;
  undefined1 auStack_80 [8];
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  end1;
  undefined1 auStack_68 [8];
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  begin1;
  undefined1 auStack_50 [8];
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  end0;
  undefined1 auStack_38 [8];
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  begin0;
  anon_class_1_0_00000001 accessor1;
  anon_class_1_0_00000001 accessor0;
  pair<unsigned_long,_int> *end_local;
  pair<unsigned_long,_int> *begin_local;
  
  _Var1._M_head_impl = (sparse_array<int,_unsigned_long> *)this;
  details::get_accessor<0ul,std::pair<unsigned_long,int>const*>();
  details::get_accessor<1ul,std::pair<unsigned_long,int>const*>();
  details::
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp:122:20)>
  ::pair_field_iterator
            ((pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
              *)auStack_38,begin);
  details::
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp:122:20)>
  ::pair_field_iterator
            ((pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
              *)auStack_50,end);
  details::
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp:122:20)>
  ::pair_field_iterator
            ((pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
              *)auStack_68,begin);
  details::
  pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp:122:20)>
  ::pair_field_iterator
            ((pair_field_iterator<const_std::pair<unsigned_long,_int>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
              *)auStack_80,end);
  indices_first._8_8_ = this;
  indices_first.it_ = in_stack_fffffffffffffee8;
  indices_last._8_8_ = in_stack_ffffffffffffff00;
  indices_last.it_ = (pair<unsigned_long,_int> *)_Var1._M_head_impl;
  __p = (pointer)void*_pstore::sparse_array::operator_cast_to_pair_field_iterator
                           ((sparse_array *)0x10,(size_t)auStack_38,indices_first,indices_last);
  first_index._8_8_ = this;
  first_index.it_ = in_stack_fffffffffffffee8;
  last_index._8_8_ = __p;
  last_index.it_ = (pair<unsigned_long,_int> *)_Var1._M_head_impl;
  last_value._8_8_ = end1.it_;
  last_value.it_ = (pair<unsigned_long,_int> *)auStack_80;
  sparse_array<pstore::details::pair_field_iterator<std::pair<unsigned_long,int>const*,pstore::details::get_accessor<0ul,std::pair<unsigned_long,int>const*>()::_lambda(std::pair<unsigned_long,int>const*)_1_const>,pstore::details::pair_field_iterator<std::pair<unsigned_long,int>const*,pstore::details::get_accessor<1ul,std::pair<unsigned_long,int>const*>()::_lambda(std::pair<unsigned_long,int>const*)_1_const>>
            ((sparse_array<int,unsigned_long> *)__p,first_index,last_index,in_stack_ffffffffffffff08
             ,last_value);
  std::
  unique_ptr<pstore::sparse_array<int,unsigned_long>,std::default_delete<pstore::sparse_array<int,unsigned_long>>>
  ::unique_ptr<std::default_delete<pstore::sparse_array<int,unsigned_long>>,void>
            ((unique_ptr<pstore::sparse_array<int,unsigned_long>,std::default_delete<pstore::sparse_array<int,unsigned_long>>>
              *)this,__p);
  return (__uniq_ptr_data<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>,_true,_true>
          )(tuple<pstore::sparse_array<int,_unsigned_long>_*,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>_>
            )_Var1._M_head_impl;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (Iterator begin, Iterator end)
        -> std::unique_ptr<sparse_array> {

        using details::get_accessor;
        using details::pair_field_iterator;

        auto const accessor0 = get_accessor<0U, Iterator> ();
        auto const accessor1 = get_accessor<1U, Iterator> ();

        // [begin0, end0) is the range of indices; [begin1, end1] is the range of values.
        auto const begin0 = pair_field_iterator<Iterator, decltype (accessor0)>{begin, accessor0};
        auto const end0 = pair_field_iterator<Iterator, decltype (accessor0)>{end, accessor0};
        auto const begin1 = pair_field_iterator<Iterator, decltype (accessor1)>{begin, accessor1};
        auto const end1 = pair_field_iterator<Iterator, decltype (accessor1)>{end, accessor1};

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (begin0, end0) sparse_array<ValueType, BitmapType> (begin0, end0, begin1, end1)};
    }